

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

QStringList * QProcess::systemEnvironment(void)

{
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QProcessEnvironment local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QProcessEnvironment::systemEnvironment();
  QProcessEnvironment::toStringList(in_RDI,&local_20);
  QProcessEnvironment::~QProcessEnvironment(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QProcess::systemEnvironment()
{
    return QProcessEnvironment::systemEnvironment().toStringList();
}